

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

Value * system_function_len(Value *context_value,TupleValue *parameter_values)

{
  Value *pVVar1;
  ListValue *list_value;
  TupleValue *tuple_value;
  StringValue *string_value;
  Value *value;
  TupleValue *parameter_values_local;
  Value *context_value_local;
  
  if (parameter_values->length == 0) {
    context_value_local = new_null_value();
  }
  else {
    pVVar1 = *parameter_values->items;
    if (pVVar1->value_type == ValueTypeStringValue) {
      context_value_local = new_integer_value(pVVar1[1].linked_variable_count);
    }
    else if (pVVar1->value_type == ValueTypeTupleValue) {
      context_value_local = new_integer_value(pVVar1[1].linked_variable_count);
    }
    else if (pVVar1->value_type == ValueTypeListValue) {
      context_value_local = new_integer_value(pVVar1[1].linked_variable_count);
    }
    else {
      context_value_local = new_null_value();
    }
  }
  return context_value_local;
}

Assistant:

Value *system_function_len(Value *context_value, TupleValue *parameter_values) {
  if (parameter_values->length == 0) return new_null_value();

  Value *value = parameter_values->items[0];

  if (value->value_type == ValueTypeStringValue) {
    StringValue *string_value = (StringValue *) value;

    return new_integer_value(string_value->length);
  }
  else if (value->value_type == ValueTypeTupleValue) {
    TupleValue *tuple_value = (TupleValue *) value;

    return new_integer_value(tuple_value->length);
  }
  else if (value->value_type == ValueTypeListValue) {
    ListValue *list_value = (ListValue *) value;

    return new_integer_value(list_value->length);
  }

  return new_null_value();
}